

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

int __thiscall
ON_Mesh::AddNgon_Expert
          (ON_Mesh *this,uint Fcount,uint *ngon_fi,bool bPermitHoles,
          ON_MeshVertexFaceMap *vertexFaceMap)

{
  ulong ngon_fi_count;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  ON_SimpleArray<unsigned_int> ngon_vi;
  ON_MeshFaceList local_60;
  ON_3dPointListRef mesh_vertex_list;
  
  if (ngon_fi == (uint *)0x0 || Fcount == 0) {
    iVar3 = -1;
  }
  else {
    ngon_fi_count = (ulong)Fcount;
    ngon_vi._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
    ngon_vi.m_a = (uint *)0x0;
    ngon_vi.m_count = 0;
    ngon_vi.m_capacity = 0;
    ON_3dPointListRef::ON_3dPointListRef(&mesh_vertex_list,this);
    ON_MeshFaceList::ON_MeshFaceList(&local_60,this);
    uVar2 = (this->m_F).m_count;
    bVar1 = HasNgons(this);
    uVar5 = 0;
    bVar6 = false;
    if (bVar1) {
      uVar5 = (this->m_Ngon).m_count;
      if (uVar5 == 0) {
        uVar5 = 0;
        bVar6 = false;
      }
      else {
        bVar6 = uVar2 == (this->m_NgonMap).m_count;
      }
    }
    iVar3 = -1;
    for (uVar4 = 0; ngon_fi_count != uVar4; uVar4 = uVar4 + 1) {
      if ((uVar2 <= ngon_fi[uVar4]) || ((bVar6 && ((this->m_NgonMap).m_a[ngon_fi[uVar4]] < uVar5))))
      goto LAB_00538d11;
    }
    if (bPermitHoles) {
      uVar2 = ON_MeshNgon::FindNgonBoundary
                        (&mesh_vertex_list,&local_60,vertexFaceMap,ngon_fi_count,ngon_fi,&ngon_vi);
    }
    else {
      uVar2 = ON_MeshNgon::FindNgonOuterBoundary
                        (&mesh_vertex_list,&local_60,vertexFaceMap,ngon_fi_count,ngon_fi,&ngon_vi);
    }
    if ((2 < uVar2) && (2 < ngon_vi.m_count)) {
      iVar3 = AddNgon(this,ngon_vi.m_count,ngon_vi.m_a,Fcount,ngon_fi);
    }
LAB_00538d11:
    ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&ngon_vi);
  }
  return iVar3;
}

Assistant:

int ON_Mesh::AddNgon_Expert(
  unsigned int Fcount,
  const unsigned int* ngon_fi,
  bool bPermitHoles,
  ON_MeshVertexFaceMap* vertexFaceMap
)
{
  unsigned int ngon_index = ON_UNSET_UINT_INDEX;
  if (Fcount < 1 || nullptr == ngon_fi)
    return ngon_index;

  ON_SimpleArray<unsigned int> ngon_vi;
  const ON_3dPointListRef mesh_vertex_list(this);
  const ON_MeshFaceList& mesh_face_list(this);

  const int face_count = m_F.Count();
  const unsigned int ngon_count0 = HasNgons() ? NgonUnsignedCount() : 0U;
  bool bCheckNgonMap = (ngon_count0 > 0 && face_count == m_NgonMap.Count());
  for (unsigned int i = 0; i < Fcount; ++i)
  {
    unsigned int fi = ngon_fi[i];
    if (fi >= (unsigned int)face_count)
      return ngon_index;
    if (bCheckNgonMap && m_NgonMap[fi] < ngon_count0)
      return ngon_index; // input faces are already in an ngon
  }

  unsigned int vi_count;
  if (bPermitHoles)
    vi_count = ON_MeshNgon::FindNgonBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );
  else
    vi_count = ON_MeshNgon::FindNgonOuterBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );

  if (vi_count < 3 || ngon_vi.Count() < 3)
    return ngon_index; // 

  return AddNgon(ngon_vi.UnsignedCount(), ngon_vi.Array(), Fcount, ngon_fi);
}